

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Exa3_ManAddCnf(Exa3_Man_t_conflict *p,int iMint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_7c;
  lit local_78;
  int nLits_1;
  int pLits_1 [8];
  int local_4c;
  int local_48;
  int nLits;
  int pLits [3];
  int iBaseSatVarJ;
  int iBaseSatVarI;
  int iVarStart;
  int Value;
  int j;
  int n;
  int k;
  int i;
  int iMint_local;
  Exa3_Man_t_conflict *p_local;
  
  iVar3 = Abc_TtGetBit(p->pTruth,iMint);
  for (n = 0; n < p->nVars; n = n + 1) {
    p->VarVals[n] = iMint >> ((byte)n & 0x1f) & 1;
  }
  sat_solver_setnvars(p->pSat,p->iVar + (p->nLutSize + 1) * p->nNodes);
  n = p->nVars;
  do {
    if (p->nObjs <= n) {
      p->iVar = (p->nLutSize + 1) * p->nNodes + p->iVar;
      return 1;
    }
    iVar1 = p->LutMask;
    iVar2 = p->nVars;
    pLits[2] = p->iVar + (p->nLutSize + 1) * (n - p->nVars);
    for (j = 0; j < p->nLutSize; j = j + 1) {
      for (iVarStart = 0; iVarStart < p->nObjs; iVarStart = iVarStart + 1) {
        if (p->VarMarks[n][j][iVarStart] != 0) {
          pLits[1] = p->iVar + (p->nLutSize + 1) * (iVarStart - p->nVars);
          for (Value = 0; Value < 2; Value = Value + 1) {
            local_48 = Abc_Var2Lit(p->VarMarks[n][j][iVarStart],1);
            nLits = Abc_Var2Lit(pLits[2] + j,Value);
            local_4c = 2;
            if (iVarStart < p->nVars) {
              if (p->VarVals[iVarStart] != Value) goto LAB_0070ca43;
            }
            else {
              pLits[0] = Abc_Var2Lit(pLits[1] + p->nLutSize,(uint)((Value != 0 ^ 0xffU) & 1));
              local_4c = 3;
LAB_0070ca43:
              iVar4 = sat_solver_addclause(p->pSat,&local_48,&local_48 + local_4c);
              if (iVar4 == 0) {
                return 0;
              }
            }
          }
        }
      }
    }
    for (Value = 0; Value < 2; Value = Value + 1) {
      if ((n != p->nObjs + -1) || (Value != iVar3)) {
        for (j = 0; j <= p->LutMask; j = j + 1) {
          local_7c = 0;
          if ((j != 0) || (Value != 1)) {
            for (iVarStart = 0; iVarStart < p->nLutSize; iVarStart = iVarStart + 1) {
              iVar4 = Abc_Var2Lit(pLits[2] + iVarStart,j >> ((byte)iVarStart & 0x1f) & 1);
              (&local_78)[local_7c] = iVar4;
              local_7c = local_7c + 1;
            }
            if (n != p->nObjs + -1) {
              iVar4 = Abc_Var2Lit(pLits[2] + iVarStart,(uint)((Value != 0 ^ 0xffU) & 1));
              (&local_78)[local_7c] = iVar4;
              local_7c = local_7c + 1;
            }
            if (0 < j) {
              iVar4 = Abc_Var2Lit(iVar1 * (n - iVar2) + j,Value);
              (&local_78)[local_7c] = iVar4;
              local_7c = local_7c + 1;
            }
            if (p->nLutSize + 2 < local_7c) {
              __assert_fail("nLits <= p->nLutSize+2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                            ,0x518,"int Exa3_ManAddCnf(Exa3_Man_t *, int)");
            }
            iVar4 = sat_solver_addclause(p->pSat,&local_78,&local_78 + local_7c);
            if (iVar4 == 0) {
              return 0;
            }
          }
        }
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

static int Exa3_ManAddCnf( Exa3_Man_t * p, int iMint )
{
    // save minterm values
    int i, k, n, j, Value = Abc_TtGetBit(p->pTruth, iMint);
    for ( i = 0; i < p->nVars; i++ )
        p->VarVals[i] = (iMint >> i) & 1;
//    sat_solver_setnvars( p->pSat, p->iVar + (p->nLutSize+1)*p->nNodes );
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar + (p->nLutSize+1)*p->nNodes );
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    for ( i = p->nVars; i < p->nObjs; i++ )
    {
        // fanin connectivity
        int iVarStart = 1 + p->LutMask*(i - p->nVars);
        int iBaseSatVarI = p->iVar + (p->nLutSize+1)*(i - p->nVars);
        for ( k = 0; k < p->nLutSize; k++ )
        {
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            {
                int iBaseSatVarJ = p->iVar + (p->nLutSize+1)*(j - p->nVars);
                for ( n = 0; n < 2; n++ )
                {
                    int pLits[3], nLits = 0;
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                    pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + k, n );
                    if ( j >= p->nVars )
                        pLits[nLits++] = Abc_Var2Lit( iBaseSatVarJ + p->nLutSize, !n );
                    else if ( p->VarVals[j] == n )
                        continue;
                    if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                        return 0;
                }
            }
        }
        // node functionality
        for ( n = 0; n < 2; n++ )
        {
            if ( i == p->nObjs - 1 && n == Value )
                continue;
            for ( k = 0; k <= p->LutMask; k++ )
            {
                int pLits[16], nLits = 0;
                if ( k == 0 && n == 1 )
                    continue;
                //pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 0, (k&1)  );
                //pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 1, (k>>1) );
                //if ( i != p->nObjs - 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + 2, !n );
                for ( j = 0; j < p->nLutSize; j++ )
                    pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + j, (k >> j) & 1 );
                if ( i != p->nObjs - 1 ) pLits[nLits++] = Abc_Var2Lit( iBaseSatVarI + j, !n );
                if ( k > 0 )             pLits[nLits++] = Abc_Var2Lit( iVarStart +  k-1,  n );
                assert( nLits <= p->nLutSize+2 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                    return 0;
            }
        }
    }
    p->iVar += (p->nLutSize+1)*p->nNodes;
    return 1;
}